

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O0

void __thiscall
HostVector_iterators_and_ranges_Test::~HostVector_iterators_and_ranges_Test
          (HostVector_iterators_and_ranges_Test *this)

{
  HostVector_iterators_and_ranges_Test *this_local;
  
  ~HostVector_iterators_and_ranges_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(HostVector, iterators_and_ranges) {
    using namespace memory;

    // length constructor
    HostVector<float> v1(100);

    // check that begin()/end() iterators work
    for(auto it=v1.begin(); it<v1.end(); ++it)
        *it = float(3.0);

    // check that range based for loop works
    for(auto &val : v1)
        val = float(3.0);
    {
        float sum = 0;
        // check it works for const
        for(auto val : v1)
            sum+=val;
        EXPECT_EQ(float(3*100), sum);
    }

    // check that std::for_each works
    std::for_each(v1.begin(), v1.end(), [] (float& val) {val+=1;}); // add 1 to every value in v1
    {
        float sum = 0;
        for(auto val : v1)
            sum+=val;
        EXPECT_EQ(float(4*100), sum);
    }
}